

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

Abc_Obj_t * Abc_NtkAddBuffsOne(Vec_Ptr_t *vBuffs,Abc_Obj_t *pFanin,int Level,int nLevelMax)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *local_28;
  Abc_Obj_t *pBuffer;
  int nLevelMax_local;
  int Level_local;
  Abc_Obj_t *pFanin_local;
  Vec_Ptr_t *vBuffs_local;
  
  iVar1 = Abc_ObjLevel(pFanin);
  if (Level + -1 < iVar1) {
    __assert_fail("Level - 1 >= Abc_ObjLevel(pFanin)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                  ,0x900,"Abc_Obj_t *Abc_NtkAddBuffsOne(Vec_Ptr_t *, Abc_Obj_t *, int, int)");
  }
  uVar2 = Abc_ObjId(pFanin);
  local_28 = (Abc_Obj_t *)Vec_PtrEntry(vBuffs,uVar2 * nLevelMax + Level);
  if (local_28 == (Abc_Obj_t *)0x0) {
    iVar1 = Abc_ObjLevel(pFanin);
    local_28 = pFanin;
    if (Level + -1 != iVar1) {
      local_28 = Abc_NtkAddBuffsOne(vBuffs,pFanin,Level + -1,nLevelMax);
    }
    pNtk = Abc_ObjNtk(pFanin);
    local_28 = Abc_NtkCreateNodeBuf(pNtk,local_28);
    uVar2 = Abc_ObjId(pFanin);
    Vec_PtrWriteEntry(vBuffs,uVar2 * nLevelMax + Level,local_28);
  }
  return local_28;
}

Assistant:

Abc_Obj_t * Abc_NtkAddBuffsOne( Vec_Ptr_t * vBuffs, Abc_Obj_t * pFanin, int Level, int nLevelMax )
{
    Abc_Obj_t * pBuffer;
    assert( Level - 1 >= Abc_ObjLevel(pFanin) );
    pBuffer = (Abc_Obj_t *)Vec_PtrEntry( vBuffs, Abc_ObjId(pFanin) * nLevelMax + Level );
    if ( pBuffer == NULL )
    {
        if ( Level - 1 == Abc_ObjLevel(pFanin) )
            pBuffer = pFanin;
        else
            pBuffer = Abc_NtkAddBuffsOne( vBuffs, pFanin, Level - 1, nLevelMax );
        pBuffer = Abc_NtkCreateNodeBuf( Abc_ObjNtk(pFanin), pBuffer ); 
        Vec_PtrWriteEntry( vBuffs, Abc_ObjId(pFanin) * nLevelMax + Level, pBuffer );
    }
    return pBuffer;
}